

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv32_impl.h
# Opt level: O3

void secp256k1_modinv32_mul_30
               (secp256k1_modinv32_signed30 *r,secp256k1_modinv32_signed30 *a,int alen,
               int32_t factor)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  int iVar34;
  uint uVar35;
  uint uVar36;
  undefined4 uVar37;
  uint extraout_EAX;
  secp256k1_modinv32_signed30 *psVar38;
  ulong uVar39;
  ulong uVar40;
  secp256k1_modinv32_signed30 *psVar41;
  long lVar42;
  uint uVar43;
  uint uVar44;
  int extraout_EDX;
  int extraout_EDX_00;
  uint *extraout_RDX;
  int32_t *piVar45;
  long lVar46;
  secp256k1_modinv32_signed30 *b;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  secp256k1_fe *r_00;
  ulong uVar53;
  uint64_t uVar54;
  uint uVar55;
  uint uVar56;
  uint uVar57;
  secp256k1_fe *a_00;
  ulong uVar58;
  secp256k1_fe *a_01;
  secp256k1_modinv32_signed30 *a_02;
  long lVar59;
  ulong uVar60;
  secp256k1_fe *r_01;
  secp256k1_fe *r_02;
  uint uVar61;
  uint uVar62;
  ulong uVar63;
  ulong uVar64;
  uint uVar65;
  long lVar66;
  ulong uVar67;
  ulong uVar68;
  ulong uVar69;
  ulong uVar70;
  ulong uVar71;
  ulong uVar72;
  ulong uVar73;
  long lVar74;
  uint uVar75;
  secp256k1_modinv32_signed30 *psVar76;
  uint uVar77;
  secp256k1_modinv32_signed30 *psVar78;
  ulong uVar79;
  uint64_t uVar80;
  secp256k1_fe *a_03;
  uint uVar81;
  uint64_t uVar82;
  code *pcVar83;
  code *pcVar84;
  uint extraout_XMM0_Da;
  uint extraout_XMM0_Db;
  uint extraout_XMM0_Dc;
  undefined1 auVar85 [16];
  uint extraout_XMM0_Dd;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  uchar auStack_2b0 [32];
  secp256k1_fe *psStack_290;
  ulong uStack_288;
  ulong uStack_280;
  secp256k1_fe *psStack_278;
  code *pcStack_270;
  code *pcStack_260;
  undefined1 auStack_258 [32];
  secp256k1_fe sStack_238;
  undefined1 auStack_208 [16];
  secp256k1_fe sStack_1f0;
  ulong uStack_1c0;
  secp256k1_fe *psStack_1b8;
  uint64_t uStack_1b0;
  code *pcStack_1a8;
  long lStack_198;
  secp256k1_fe sStack_190;
  secp256k1_fe *psStack_158;
  secp256k1_fe sStack_150;
  secp256k1_fe sStack_120;
  ulong uStack_e8;
  ulong uStack_e0;
  ulong uStack_d8;
  secp256k1_modinv32_signed30 *psStack_d0;
  ulong uStack_c8;
  code *pcStack_c0;
  uint uStack_b8;
  uint uStack_b4;
  uint uStack_b0;
  uint uStack_ac;
  uint uStack_a8;
  uint uStack_a4;
  secp256k1_modinv32_signed30 *psStack_a0;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  int32_t iStack_84;
  secp256k1_modinv32_signed30 *psStack_80;
  secp256k1_modinv32_signed30 *psStack_78;
  secp256k1_modinv32_signed30 *psStack_70;
  secp256k1_modinv32_signed30 *psStack_68;
  secp256k1_modinv32_signed30 *psStack_60;
  code *pcStack_58;
  long lStack_48;
  long lStack_40;
  
  lVar66 = 0;
  psVar38 = (secp256k1_modinv32_signed30 *)0x0;
  do {
    if (lVar66 < alen) {
      psVar38 = (secp256k1_modinv32_signed30 *)
                ((long)psVar38->v + (long)a->v[lVar66] * (long)factor);
    }
    r->v[lVar66] = (uint)psVar38 & 0x3fffffff;
    psVar38 = (secp256k1_modinv32_signed30 *)((long)psVar38 >> 0x1e);
    lVar66 = lVar66 + 1;
  } while (lVar66 != 8);
  if (8 < alen) {
    psVar38 = (secp256k1_modinv32_signed30 *)((long)psVar38->v + (long)a->v[8] * (long)factor);
  }
  psVar41 = (secp256k1_modinv32_signed30 *)(long)(int)psVar38;
  if (psVar41 == psVar38) {
    r->v[8] = (int)psVar38;
    return;
  }
  secp256k1_modinv32_mul_30_cold_1();
  uVar56 = *extraout_RDX;
  psVar78 = (secp256k1_modinv32_signed30 *)(long)(int)uVar56;
  uVar44 = extraout_RDX[1];
  lVar66 = (long)(int)uVar44;
  uVar57 = extraout_RDX[2];
  psVar38 = (secp256k1_modinv32_signed30 *)(long)(int)uVar57;
  lStack_48 = (long)(int)extraout_RDX[3];
  a_00 = (secp256k1_fe *)0x9;
  pcStack_58 = (code *)0x156018;
  a_02 = r;
  iVar34 = secp256k1_modinv32_mul_cmp_30(r,9,psVar41,-2);
  if (iVar34 < 1) {
    pcStack_58 = (code *)0x156280;
    secp256k1_modinv32_update_de_30_cold_12();
LAB_00156280:
    pcStack_58 = (code *)0x156285;
    secp256k1_modinv32_update_de_30_cold_11();
LAB_00156285:
    pcStack_58 = (code *)0x15628a;
    secp256k1_modinv32_update_de_30_cold_10();
LAB_0015628a:
    pcStack_58 = (code *)0x15628f;
    secp256k1_modinv32_update_de_30_cold_9();
LAB_0015628f:
    pcStack_58 = (code *)0x156294;
    secp256k1_modinv32_update_de_30_cold_8();
LAB_00156294:
    pcStack_58 = (code *)0x156299;
    secp256k1_modinv32_update_de_30_cold_7();
LAB_00156299:
    pcStack_58 = (code *)0x15629e;
    secp256k1_modinv32_update_de_30_cold_1();
LAB_0015629e:
    pcStack_58 = (code *)0x1562a3;
    secp256k1_modinv32_update_de_30_cold_2();
    psVar76 = psVar41;
LAB_001562a3:
    pcStack_58 = (code *)0x1562a8;
    secp256k1_modinv32_update_de_30_cold_6();
LAB_001562a8:
    pcStack_58 = (code *)0x1562ad;
    secp256k1_modinv32_update_de_30_cold_5();
LAB_001562ad:
    pcStack_58 = (code *)0x1562b2;
    secp256k1_modinv32_update_de_30_cold_4();
  }
  else {
    a_00 = (secp256k1_fe *)0x9;
    pcStack_58 = (code *)0x156035;
    a_02 = r;
    iVar34 = secp256k1_modinv32_mul_cmp_30(r,9,psVar41,1);
    if (-1 < iVar34) goto LAB_00156280;
    a_00 = (secp256k1_fe *)0x9;
    pcStack_58 = (code *)0x156052;
    a_02 = a;
    iVar34 = secp256k1_modinv32_mul_cmp_30(a,9,psVar41,-2);
    if (iVar34 < 1) goto LAB_00156285;
    a_00 = (secp256k1_fe *)0x9;
    pcStack_58 = (code *)0x15606f;
    a_02 = a;
    iVar34 = secp256k1_modinv32_mul_cmp_30(a,9,psVar41,1);
    if (-1 < iVar34) goto LAB_0015628a;
    psVar76 = (secp256k1_modinv32_signed30 *)-(long)psVar78;
    if (0 < (long)psVar78) {
      psVar76 = psVar78;
    }
    lVar42 = -lVar66;
    if (lVar66 < 1) {
      lVar42 = lVar66;
    }
    if (lVar42 + 0x40000000 < (long)psVar76) goto LAB_0015628f;
    psVar76 = (secp256k1_modinv32_signed30 *)-(long)psVar38;
    if (0 < (long)psVar38) {
      psVar76 = psVar38;
    }
    lVar42 = -lStack_48;
    if (lStack_48 < 1) {
      lVar42 = lStack_48;
    }
    if (lVar42 + 0x40000000 < (long)psVar76) goto LAB_00156294;
    uVar61 = r->v[8] >> 0x1f;
    uVar55 = a->v[8] >> 0x1f;
    a_00 = (secp256k1_fe *)(ulong)uVar55;
    iVar34 = (uVar55 & uVar44) + (uVar61 & uVar56);
    a_02 = (secp256k1_modinv32_signed30 *)(a->v[0] * lVar66 + (long)r->v[0] * (long)psVar78);
    lVar42 = (long)(int)(iVar34 - ((int)a_02 * psVar41[1].v[0] + iVar34 & 0x3fffffffU));
    piVar45 = (int32_t *)((long)a_02->v + lVar42 * psVar41->v[0]);
    if (((ulong)piVar45 & 0x3fffffff) != 0) goto LAB_00156299;
    iVar34 = (uVar55 & (uint)lStack_48) + (uVar61 & uVar57);
    lVar74 = a->v[0] * lStack_48 + (long)r->v[0] * (long)psVar38;
    a_02 = (secp256k1_modinv32_signed30 *)0x3fffffff;
    uVar56 = iVar34 - (psVar41[1].v[0] * (int)lVar74 + iVar34 & 0x3fffffffU);
    a_00 = (secp256k1_fe *)(ulong)uVar56;
    uVar39 = (long)psVar41->v[0] * (long)(int)uVar56 + lVar74;
    lStack_40 = lVar42;
    if ((uVar39 & 0x3fffffff) != 0) goto LAB_0015629e;
    lVar74 = (long)uVar39 >> 0x1e;
    lVar46 = (long)piVar45 >> 0x1e;
    lVar59 = 1;
    do {
      lVar46 = psVar41->v[lVar59] * lVar42 + a->v[lVar59] * lVar66 +
               (long)r->v[lVar59] * (long)psVar78 + lVar46;
      psVar76 = (secp256k1_modinv32_signed30 *)(a->v[lVar59] * lStack_48);
      lVar74 = (long)psVar76->v +
               (long)r->v[lVar59] * (long)psVar38 + lVar74 +
               (long)psVar41->v[lVar59] * (long)(int)uVar56;
      r->v[lVar59 + -1] = (uint)lVar46 & 0x3fffffff;
      a->v[lVar59 + -1] = (uint)lVar74 & 0x3fffffff;
      lVar59 = lVar59 + 1;
      lVar74 = lVar74 >> 0x1e;
      lVar46 = lVar46 >> 0x1e;
    } while (lVar59 != 9);
    r->v[8] = (int32_t)lVar46;
    a->v[8] = (int32_t)lVar74;
    a_00 = (secp256k1_fe *)0x9;
    pcStack_58 = (code *)0x156219;
    a_02 = r;
    iVar34 = secp256k1_modinv32_mul_cmp_30(r,9,psVar41,-2);
    psVar38 = a;
    psVar78 = psVar41;
    if (iVar34 < 1) goto LAB_001562a3;
    a_00 = (secp256k1_fe *)0x9;
    pcStack_58 = (code *)0x156236;
    a_02 = r;
    iVar34 = secp256k1_modinv32_mul_cmp_30(r,9,psVar41,1);
    if (-1 < iVar34) goto LAB_001562a8;
    a_00 = (secp256k1_fe *)0x9;
    pcStack_58 = (code *)0x15624f;
    a_02 = a;
    iVar34 = secp256k1_modinv32_mul_cmp_30(a,9,psVar41,-2);
    if (iVar34 < 1) goto LAB_001562ad;
    a_00 = (secp256k1_fe *)0x9;
    pcStack_58 = (code *)0x156268;
    a_02 = a;
    iVar34 = secp256k1_modinv32_mul_cmp_30(a,9,psVar41,1);
    if (iVar34 < 0) {
      return;
    }
  }
  pcStack_58 = secp256k1_modinv32_normalize_30;
  secp256k1_modinv32_update_de_30_cold_3();
  uVar56 = a_02->v[0];
  uVar47 = (ulong)uVar56;
  uVar44 = a_02->v[3];
  uVar53 = (ulong)uVar44;
  uVar57 = a_02->v[4];
  uVar79 = (ulong)uVar57;
  uVar55 = a_02->v[5];
  uVar40 = (ulong)uVar55;
  psVar41 = (secp256k1_modinv32_signed30 *)(ulong)(uint)a_02->v[6];
  uVar61 = a_02->v[7];
  uVar39 = (ulong)uVar61;
  iStack_84 = a_02->v[8];
  lVar42 = 0;
  do {
    psStack_80 = psVar38;
    psStack_78 = psVar76;
    psStack_70 = psVar78;
    psStack_68 = a;
    psStack_60 = r;
    pcStack_58 = (code *)lVar66;
    if (a_02->v[lVar42] < -0x3fffffff) {
      pcStack_c0 = (code *)0x156600;
      secp256k1_modinv32_normalize_30_cold_7();
LAB_00156600:
      pcStack_c0 = (code *)0x156605;
      secp256k1_modinv32_normalize_30_cold_6();
      goto LAB_00156605;
    }
    if (0x3fffffff < a_02->v[lVar42]) goto LAB_00156600;
    lVar42 = lVar42 + 1;
  } while (lVar42 != 9);
  uStack_a4 = (uint)a_00;
  a_00 = (secp256k1_fe *)0x9;
  pcStack_c0 = (code *)0x15633d;
  psVar41 = a_02;
  uStack_b0 = a_02->v[1];
  uStack_ac = a_02->v[2];
  uStack_a8 = a_02->v[6];
  psStack_a0 = b;
  iVar34 = secp256k1_modinv32_mul_cmp_30(a_02,9,b,-2);
  if (iVar34 < 1) {
LAB_00156605:
    pcStack_c0 = (code *)0x15660a;
    secp256k1_modinv32_normalize_30_cold_5();
LAB_0015660a:
    pcStack_c0 = (code *)0x15660f;
    secp256k1_modinv32_normalize_30_cold_4();
LAB_0015660f:
    pcStack_c0 = (code *)0x156614;
    secp256k1_modinv32_normalize_30_cold_3();
LAB_00156614:
    pcStack_c0 = (code *)0x156619;
    secp256k1_modinv32_normalize_30_cold_2();
  }
  else {
    a_00 = (secp256k1_fe *)0x9;
    pcStack_c0 = (code *)0x15635c;
    psVar41 = a_02;
    iVar34 = secp256k1_modinv32_mul_cmp_30(a_02,9,psStack_a0,1);
    if (-1 < iVar34) goto LAB_0015660a;
    uVar35 = iStack_84 >> 0x1f;
    uStack_88 = psStack_a0->v[1];
    uVar36 = (uVar35 & uStack_88) + uStack_b0;
    uStack_b0 = psStack_a0->v[2];
    uVar43 = (uVar35 & uStack_b0) + uStack_ac;
    uStack_ac = psStack_a0->v[3];
    uStack_8c = psStack_a0->v[4];
    uStack_90 = psStack_a0->v[5];
    uStack_94 = psStack_a0->v[6];
    uVar77 = (uVar35 & uStack_94) + uStack_a8;
    uStack_a8 = psStack_a0->v[7];
    uStack_b4 = (int)uStack_a4 >> 0x1f;
    uStack_a4 = psStack_a0->v[8];
    uVar65 = ((uVar35 & psStack_a0->v[0]) + uVar56 ^ uStack_b4) - uStack_b4;
    uVar62 = ((int)uVar65 >> 0x1e) + ((uVar36 ^ uStack_b4) - uStack_b4);
    uVar36 = ((int)uVar62 >> 0x1e) + ((uVar43 ^ uStack_b4) - uStack_b4);
    uVar81 = ((int)uVar36 >> 0x1e) + (((uVar35 & uStack_ac) + uVar44 ^ uStack_b4) - uStack_b4);
    uVar44 = ((int)uVar81 >> 0x1e) + (((uVar35 & uStack_8c) + uVar57 ^ uStack_b4) - uStack_b4);
    uVar56 = ((int)uVar44 >> 0x1e) + (((uVar35 & uStack_90) + uVar55 ^ uStack_b4) - uStack_b4);
    uVar57 = ((int)uVar56 >> 0x1e) + ((uVar77 ^ uStack_b4) - uStack_b4);
    uVar55 = ((int)uVar57 >> 0x1e) + (((uVar35 & uStack_a8) + uVar61 ^ uStack_b4) - uStack_b4);
    uVar75 = ((int)uVar55 >> 0x1e) + (((uVar35 & uStack_a4) + iStack_84 ^ uStack_b4) - uStack_b4);
    uVar40 = (ulong)uVar75;
    uStack_b8 = (int)uVar75 >> 0x1f;
    uVar77 = (psStack_a0->v[0] & uStack_b8) + (uVar65 & 0x3fffffff);
    uVar43 = (uStack_90 & uStack_b8) + (uVar56 & 0x3fffffff);
    uVar47 = (ulong)uVar43;
    uVar65 = (uStack_94 & uStack_b8) + (uVar57 & 0x3fffffff);
    uVar53 = (ulong)uVar65;
    uVar56 = ((int)uVar77 >> 0x1e) + (uStack_88 & uStack_b8) + (uVar62 & 0x3fffffff);
    uVar57 = ((int)uVar56 >> 0x1e) + (uStack_b0 & uStack_b8) + (uVar36 & 0x3fffffff);
    uVar61 = ((int)uVar57 >> 0x1e) + (uStack_ac & uStack_b8) + (uVar81 & 0x3fffffff);
    uVar35 = ((int)uVar61 >> 0x1e) + (uStack_8c & uStack_b8) + (uVar44 & 0x3fffffff);
    uVar43 = ((int)uVar35 >> 0x1e) + uVar43;
    uVar65 = ((int)uVar43 >> 0x1e) + uVar65;
    uVar44 = ((int)uVar65 >> 0x1e) + (uStack_a8 & uStack_b8) + (uVar55 & 0x3fffffff);
    uVar55 = ((int)uVar44 >> 0x1e) + (uStack_a4 & uStack_b8) + uVar75;
    uVar79 = (ulong)uVar55;
    uVar61 = uVar61 & 0x3fffffff;
    a_00 = (secp256k1_fe *)(ulong)uVar61;
    uVar35 = uVar35 & 0x3fffffff;
    psVar41 = (secp256k1_modinv32_signed30 *)(ulong)uVar35;
    uVar44 = uVar44 & 0x3fffffff;
    uVar39 = (ulong)uVar44;
    a_02->v[0] = uVar77 & 0x3fffffff;
    a_02->v[1] = uVar56 & 0x3fffffff;
    a_02->v[2] = uVar57 & 0x3fffffff;
    a_02->v[3] = uVar61;
    a_02->v[4] = uVar35;
    a_02->v[5] = uVar43 & 0x3fffffff;
    a_02->v[6] = uVar65 & 0x3fffffff;
    a_02->v[7] = uVar44;
    a_02->v[8] = uVar55;
    if (0x3fffffff < uVar55) goto LAB_0015660f;
    a_00 = (secp256k1_fe *)0x9;
    pcStack_c0 = (code *)0x1565cd;
    psVar41 = a_02;
    iVar34 = secp256k1_modinv32_mul_cmp_30(a_02,9,psStack_a0,0);
    if (iVar34 < 0) goto LAB_00156614;
    a_00 = (secp256k1_fe *)0x9;
    pcStack_c0 = (code *)0x1565e8;
    psVar41 = a_02;
    iVar34 = secp256k1_modinv32_mul_cmp_30(a_02,9,psStack_a0,1);
    if (iVar34 < 0) {
      return;
    }
  }
  pcStack_c0 = test_inverse_field;
  secp256k1_modinv32_normalize_30_cold_1();
  psStack_158 = (secp256k1_fe *)secp256k1_fe_inv_var;
  if (extraout_EDX == 0) {
    psStack_158 = (secp256k1_fe *)secp256k1_fe_inv;
  }
  pcStack_1a8 = (code *)0x156655;
  uStack_e8 = uVar39;
  uStack_e0 = uVar40;
  uStack_d8 = uVar53;
  psStack_d0 = a_02;
  uStack_c8 = uVar47;
  pcStack_c0 = (code *)uVar79;
  (*(code *)psStack_158)(&sStack_190);
  if (psVar41 != (secp256k1_modinv32_signed30 *)0x0) {
    *(uint64_t *)(psVar41->v + 8) = sStack_190.n[4];
    *(ulong *)(psVar41[1].v + 1) = CONCAT44(sStack_190.normalized,sStack_190.magnitude);
    *(uint64_t *)(psVar41->v + 4) = sStack_190.n[2];
    *(uint64_t *)(psVar41->v + 6) = sStack_190.n[3];
    *(uint64_t *)psVar41->v = sStack_190.n[0];
    *(uint64_t *)(psVar41->v + 2) = sStack_190.n[1];
  }
  uVar82 = 0xfffffffffffff;
  uVar79 = 0xf000000000000;
  uVar53 = 0xffffffffffff;
  uVar39 = 0x1000003d0;
  sStack_120.n[0] = a_00->n[0];
  sStack_120.n[1] = a_00->n[1];
  sStack_120.n[2] = a_00->n[2];
  sStack_120.n[3] = a_00->n[3];
  sStack_120.n[4] = a_00->n[4];
  sStack_120.magnitude = a_00->magnitude;
  sStack_120.normalized = a_00->normalized;
  a_03 = &sStack_120;
  pcStack_1a8 = (code *)0x1566cc;
  secp256k1_fe_verify(a_03);
  lStack_198 = 0x1000003d1;
  uVar40 = (sStack_120.n[4] >> 0x30) * 0x1000003d1 + sStack_120.n[0];
  if (((uVar40 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar40 & 0xfffffffffffff) == 0)) {
    uVar47 = (uVar40 >> 0x34) + sStack_120.n[1];
    uVar58 = (uVar47 >> 0x34) + sStack_120.n[2];
    uVar60 = (uVar58 >> 0x34) + sStack_120.n[3];
    uVar63 = (uVar60 >> 0x34) + (sStack_120.n[4] & 0xffffffffffff);
    if ((((uVar47 | uVar40 | uVar58 | uVar60) & 0xfffffffffffff) != 0 || uVar63 != 0) &&
       (((uVar40 | 0x1000003d0) & uVar47 & uVar58 & uVar60 & (uVar63 ^ 0xf000000000000)) !=
        0xfffffffffffff)) goto LAB_0015676f;
LAB_00156b83:
    a_00 = &sStack_190;
    pcStack_1a8 = (code *)0x156b90;
    secp256k1_fe_verify(a_00);
    uVar53 = uVar53 & sStack_190.n[4];
    uVar40 = (sStack_190.n[4] >> 0x30) * lStack_198 + sStack_190.n[0];
    uVar47 = (uVar40 >> 0x34) + sStack_190.n[1];
    uVar58 = (uVar47 >> 0x34) + sStack_190.n[2];
    a_01 = (secp256k1_fe *)((uVar58 >> 0x34) + sStack_190.n[3]);
    uVar60 = ((ulong)a_01 >> 0x34) + uVar53;
    if ((((uVar47 | uVar40 | uVar58 | (ulong)a_01) & uVar82) == 0 && uVar60 == 0) ||
       (r_01 = (secp256k1_fe *)(uVar60 ^ uVar79),
       ((uVar40 ^ uVar39) & uVar47 & uVar58 & (ulong)a_01 & (ulong)r_01) == uVar82)) {
      return;
    }
  }
  else {
LAB_0015676f:
    pcStack_1a8 = (code *)0x156787;
    a_01 = a_00;
    secp256k1_fe_mul(&sStack_120,a_00,&sStack_190);
    pcStack_1a8 = (code *)0x15678f;
    secp256k1_fe_verify(&sStack_120);
    r_01 = &fe_minus_one;
    pcStack_1a8 = (code *)0x15679b;
    secp256k1_fe_verify(&fe_minus_one);
    if (sStack_120.magnitude < 0x20) {
      sStack_120.n[0] = sStack_120.n[0] + 0xffffefffffc2e;
      sStack_120.n[1] = sStack_120.n[1] + 0xfffffffffffff;
      sStack_120.n[2] = sStack_120.n[2] + 0xfffffffffffff;
      sStack_120.n[3] = sStack_120.n[3] + 0xfffffffffffff;
      sStack_120.n[4] = sStack_120.n[4] + 0xffffffffffff;
      sStack_120.normalized = 0;
      sStack_120.magnitude = sStack_120.magnitude + 1;
      pcStack_1a8 = (code *)0x1567f0;
      secp256k1_fe_verify(&sStack_120);
      pcStack_1a8 = (code *)0x1567f8;
      secp256k1_fe_verify(&sStack_120);
      uVar40 = (sStack_120.n[4] >> 0x30) * lStack_198 + sStack_120.n[0];
      uVar53 = (uVar40 >> 0x34) + sStack_120.n[1];
      uVar47 = (uVar53 >> 0x34) + sStack_120.n[2];
      a_01 = (secp256k1_fe *)((uVar47 >> 0x34) + sStack_120.n[3]);
      uVar58 = ((ulong)a_01 >> 0x34) + (sStack_120.n[4] & 0xffffffffffff);
      if ((((uVar53 | uVar40 | uVar47 | (ulong)a_01) & 0xfffffffffffff) != 0 || uVar58 != 0) &&
         (r_01 = (secp256k1_fe *)(uVar58 ^ 0xf000000000000),
         ((uVar40 ^ 0x1000003d0) & uVar53 & uVar47 & (ulong)a_01 & (ulong)r_01) != 0xfffffffffffff))
      goto LAB_00156c11;
      sStack_150.n[0] = a_00->n[0];
      sStack_150.n[1] = a_00->n[1];
      sStack_150.n[2] = a_00->n[2];
      sStack_150.n[3] = a_00->n[3];
      sStack_150.n[4] = a_00->n[4];
      sStack_150.magnitude = a_00->magnitude;
      sStack_150.normalized = a_00->normalized;
      a_00 = &sStack_150;
      pcStack_1a8 = (code *)0x156890;
      secp256k1_fe_verify(a_00);
      r_01 = &fe_minus_one;
      pcStack_1a8 = (code *)0x15689c;
      secp256k1_fe_verify(&fe_minus_one);
      if (0x1f < sStack_150.magnitude) goto LAB_00156c16;
      uVar54 = sStack_150.n[0] + 0xffffefffffc2e;
      uVar80 = sStack_150.n[1] + 0xfffffffffffff;
      uVar82 = sStack_150.n[2] + 0xfffffffffffff;
      uVar79 = sStack_150.n[3] + 0xfffffffffffff;
      uVar39 = sStack_150.n[4] + 0xffffffffffff;
      sStack_150.normalized = 0;
      sStack_150.magnitude = sStack_150.magnitude + 1;
      pcStack_1a8 = (code *)0x156911;
      sStack_150.n[0] = uVar54;
      sStack_150.n[1] = uVar80;
      sStack_150.n[2] = uVar82;
      sStack_150.n[3] = uVar79;
      sStack_150.n[4] = uVar39;
      secp256k1_fe_verify(&sStack_150);
      pcStack_1a8 = (code *)0x156919;
      secp256k1_fe_verify(&sStack_150);
      a_03 = psStack_158;
      uVar40 = (uVar39 >> 0x30) * lStack_198 + uVar54;
      if (((uVar40 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar40 & 0xfffffffffffff) == 0)) {
        uVar39 = uVar39 & 0xffffffffffff;
        uVar60 = uVar80 + (uVar40 >> 0x34);
        uVar53 = (uVar60 >> 0x34) + uVar82;
        uVar47 = (uVar53 >> 0x34) + uVar79;
        uVar58 = (uVar47 >> 0x34) + uVar39;
        if (((uVar60 | uVar40 | uVar53 | uVar47) & 0xfffffffffffff) == 0 && uVar58 == 0) {
          return;
        }
        if (((uVar40 | 0x1000003d0) & uVar60 & uVar53 & uVar47 & (uVar58 ^ 0xf000000000000)) ==
            0xfffffffffffff) {
          return;
        }
      }
      a_01 = &sStack_150;
      pcStack_1a8 = (code *)0x1569d9;
      (*(code *)psStack_158)();
      a_00 = &sStack_190;
      pcStack_1a8 = (code *)0x1569e6;
      secp256k1_fe_verify(a_00);
      r_01 = &fe_minus_one;
      pcStack_1a8 = (code *)0x1569f2;
      secp256k1_fe_verify(&fe_minus_one);
      if (0x1f < sStack_190.magnitude) goto LAB_00156c1b;
      a_00 = &sStack_190;
      sStack_190.n[0] = sStack_190.n[0] + 0xffffefffffc2e;
      sStack_190.n[1] = sStack_190.n[1] + 0xfffffffffffff;
      sStack_190.n[2] = sStack_190.n[2] + 0xfffffffffffff;
      sStack_190.n[3] = sStack_190.n[3] + 0xfffffffffffff;
      sStack_190.n[4] = sStack_190.n[4] + 0xffffffffffff;
      sStack_190.magnitude = sStack_190.magnitude + 1;
      uVar53 = 0;
      sStack_190.normalized = 0;
      pcStack_1a8 = (code *)0x156a3b;
      secp256k1_fe_verify(a_00);
      pcStack_1a8 = (code *)0x156a44;
      a_01 = a_00;
      (*(code *)a_03)(a_00);
      pcStack_1a8 = (code *)0x156a4c;
      secp256k1_fe_verify(a_00);
      sStack_190.n[0] = sStack_190.n[0] + 1;
      sStack_190.magnitude = sStack_190.magnitude + 1;
      sStack_190.normalized = 0;
      pcStack_1a8 = (code *)0x156a5d;
      secp256k1_fe_verify(a_00);
      pcStack_1a8 = (code *)0x156a65;
      secp256k1_fe_verify(a_00);
      a_03 = &sStack_150;
      pcStack_1a8 = (code *)0x156a72;
      r_01 = a_03;
      secp256k1_fe_verify(a_03);
      if (sStack_150.magnitude + sStack_190.magnitude < 0x21) {
        sStack_190.n[0] = sStack_190.n[0] + sStack_150.n[0];
        sStack_190.n[1] = sStack_190.n[1] + sStack_150.n[1];
        sStack_190.n[2] = sStack_190.n[2] + sStack_150.n[2];
        sStack_190.n[3] = sStack_190.n[3] + sStack_150.n[3];
        sStack_190.n[4] = sStack_190.n[4] + sStack_150.n[4];
        sStack_190.normalized = 0;
        pcStack_1a8 = (code *)0x156ac0;
        sStack_190.magnitude = sStack_150.magnitude + sStack_190.magnitude;
        secp256k1_fe_verify(&sStack_190);
        pcStack_1a8 = (code *)0x156ac8;
        secp256k1_fe_verify(&sStack_190);
        uVar40 = (sStack_190.n[4] >> 0x30) * lStack_198 + sStack_190.n[0];
        if (((uVar40 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar40 & 0xfffffffffffff) == 0)) {
          uVar47 = (uVar40 >> 0x34) + sStack_190.n[1];
          uVar58 = (uVar47 >> 0x34) + sStack_190.n[2];
          uVar60 = (uVar58 >> 0x34) + sStack_190.n[3];
          uVar63 = (uVar60 >> 0x34) + (sStack_190.n[4] & 0xffffffffffff);
          if (((uVar47 | uVar40 | uVar58 | uVar60) & 0xfffffffffffff) == 0 && uVar63 == 0) {
            return;
          }
          if (((uVar40 | 0x1000003d0) & uVar47 & uVar58 & uVar60 & (uVar63 ^ 0xf000000000000)) ==
              0xfffffffffffff) {
            return;
          }
        }
        pcStack_1a8 = (code *)0x156b83;
        test_inverse_field_cold_2();
        goto LAB_00156b83;
      }
    }
    else {
      pcStack_1a8 = (code *)0x156c11;
      test_inverse_field_cold_7();
LAB_00156c11:
      pcStack_1a8 = (code *)0x156c16;
      test_inverse_field_cold_6();
LAB_00156c16:
      a_03 = &sStack_120;
      pcStack_1a8 = (code *)0x156c1b;
      test_inverse_field_cold_5();
LAB_00156c1b:
      uVar53 = 0xffffffffffff;
      pcStack_1a8 = (code *)0x156c20;
      test_inverse_field_cold_4();
    }
    pcStack_1a8 = (code *)0x156c25;
    test_inverse_field_cold_3();
  }
  pcStack_1a8 = test_inverse_scalar;
  test_inverse_field_cold_1();
  pcVar83 = secp256k1_scalar_inverse_var;
  if (extraout_EDX_00 == 0) {
    pcVar83 = secp256k1_scalar_inverse;
  }
  r_00 = (secp256k1_fe *)auStack_258;
  pcStack_270 = (code *)0x156c60;
  r_02 = r_00;
  sStack_1f0.n[4] = (uint64_t)a_00;
  sStack_1f0._40_8_ = uVar39;
  uStack_1c0 = uVar79;
  psStack_1b8 = a_03;
  uStack_1b0 = uVar82;
  pcStack_1a8 = (code *)uVar53;
  uVar37 = (*pcVar83)();
  if (r_01 != (secp256k1_fe *)0x0) {
    r_01->n[2] = CONCAT44(auStack_258._20_4_,auStack_258._16_4_);
    r_01->n[3] = CONCAT44(auStack_258._28_4_,auStack_258._24_4_);
    r_01->n[0] = CONCAT44(auStack_258._4_4_,auStack_258._0_4_);
    r_01->n[1] = CONCAT44(auStack_258._12_4_,auStack_258._8_4_);
  }
  uVar44 = 0;
  uVar57 = 0;
  uVar55 = 0;
  uVar61 = 0;
  auVar86._0_4_ = -(uint)((int)a_01->n[2] == 0 && (int)a_01->n[0] == 0);
  auVar86._4_4_ = -(uint)(*(int *)((long)a_01->n + 0x14) == 0 && *(int *)((long)a_01->n + 4) == 0);
  auVar86._8_4_ = -(uint)((int)a_01->n[3] == 0 && (int)a_01->n[1] == 0);
  auVar86._12_4_ =
       -(uint)(*(int *)((long)a_01->n + 0x1c) == 0 && *(int *)((long)a_01->n + 0xc) == 0);
  uVar56 = movmskps(uVar37,auVar86);
  uVar56 = uVar56 ^ 0xf;
  if (uVar56 != 0) {
    uVar40 = a_01->n[0];
    uVar53 = a_01->n[1];
    uVar47 = a_01->n[2];
    uVar52 = CONCAT44(auStack_258._4_4_,auStack_258._0_4_);
    uVar39 = CONCAT44(auStack_258._12_4_,auStack_258._8_4_);
    uVar79 = CONCAT44(auStack_258._20_4_,auStack_258._16_4_);
    r_01 = (secp256k1_fe *)CONCAT44(auStack_258._28_4_,auStack_258._24_4_);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar40;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = uVar52;
    uVar48 = SUB168(auVar1 * auVar17,8);
    auVar33._8_8_ = 0;
    auVar33._0_8_ = uVar48;
    sStack_238.n[0] = SUB168(auVar1 * auVar17,0);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar40;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = uVar39;
    auVar2 = auVar2 * auVar18;
    uVar64 = SUB168(auVar2 + auVar33,0);
    uVar67 = SUB168(auVar2 + auVar33,8);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar53;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = uVar52;
    uVar49 = SUB168(auVar3 * auVar19,8);
    uVar63 = SUB168(auVar3 * auVar19,0);
    uVar58 = (ulong)CARRY8(uVar64,uVar63);
    uVar60 = uVar67 + uVar49;
    uVar68 = uVar60 + uVar58;
    uVar70 = (ulong)CARRY8(auVar2._8_8_,(ulong)CARRY8(uVar48,auVar2._0_8_)) +
             (ulong)(CARRY8(uVar67,uVar49) || CARRY8(uVar60,uVar58));
    sStack_238.n[1] = uVar64 + uVar63;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar40;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = uVar79;
    uVar50 = SUB168(auVar4 * auVar20,8);
    uVar58 = SUB168(auVar4 * auVar20,0);
    uVar63 = uVar68 + uVar58;
    uVar58 = (ulong)CARRY8(uVar68,uVar58);
    uVar48 = uVar70 + uVar50;
    uVar71 = uVar48 + uVar58;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar53;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = uVar39;
    uVar68 = SUB168(auVar5 * auVar21,8);
    uVar60 = SUB168(auVar5 * auVar21,0);
    uVar69 = uVar63 + uVar60;
    uVar60 = (ulong)CARRY8(uVar63,uVar60);
    uVar49 = uVar71 + uVar68;
    uVar72 = uVar49 + uVar60;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar47;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = uVar52;
    uVar51 = SUB168(auVar6 * auVar22,8);
    uVar67 = SUB168(auVar6 * auVar22,0);
    uVar63 = (ulong)CARRY8(uVar69,uVar67);
    uVar64 = uVar72 + uVar51;
    uVar73 = uVar64 + uVar63;
    uVar70 = (ulong)(CARRY8(uVar70,uVar50) || CARRY8(uVar48,uVar58)) +
             (ulong)(CARRY8(uVar71,uVar68) || CARRY8(uVar49,uVar60)) +
             (ulong)(CARRY8(uVar72,uVar51) || CARRY8(uVar64,uVar63));
    sStack_238.n[2] = uVar69 + uVar67;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar40;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = r_01;
    uVar67 = SUB168(auVar7 * auVar23,8);
    uVar40 = SUB168(auVar7 * auVar23,0);
    uVar60 = uVar73 + uVar40;
    uVar40 = (ulong)CARRY8(uVar73,uVar40);
    uVar48 = uVar70 + uVar67;
    uVar69 = uVar48 + uVar40;
    pcVar84 = (code *)a_01->n[3];
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar53;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = uVar79;
    uVar50 = SUB168(auVar8 * auVar24,8);
    uVar58 = SUB168(auVar8 * auVar24,0);
    uVar63 = uVar60 + uVar58;
    uVar58 = (ulong)CARRY8(uVar60,uVar58);
    uVar49 = uVar69 + uVar50;
    uVar71 = uVar49 + uVar58;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar47;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = uVar39;
    uVar68 = SUB168(auVar9 * auVar25,8);
    uVar60 = SUB168(auVar9 * auVar25,0);
    uVar73 = uVar63 + uVar60;
    uVar60 = (ulong)CARRY8(uVar63,uVar60);
    uVar64 = uVar71 + uVar68;
    uVar72 = uVar64 + uVar60;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = pcVar84;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = uVar52;
    uVar51 = SUB168(auVar10 * auVar26,8);
    uVar63 = SUB168(auVar10 * auVar26,0);
    sStack_238.n[3] = uVar73 + uVar63;
    uVar63 = (ulong)CARRY8(uVar73,uVar63);
    uVar52 = uVar72 + uVar51;
    uVar73 = uVar52 + uVar63;
    uVar67 = (ulong)(CARRY8(uVar70,uVar67) || CARRY8(uVar48,uVar40)) +
             (ulong)(CARRY8(uVar69,uVar50) || CARRY8(uVar49,uVar58)) +
             (ulong)(CARRY8(uVar71,uVar68) || CARRY8(uVar64,uVar60)) +
             (ulong)(CARRY8(uVar72,uVar51) || CARRY8(uVar52,uVar63));
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uVar53;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = r_01;
    uVar49 = SUB168(auVar11 * auVar27,8);
    uVar40 = SUB168(auVar11 * auVar27,0);
    uVar58 = uVar73 + uVar40;
    uVar40 = (ulong)CARRY8(uVar73,uVar40);
    uVar60 = uVar67 + uVar49;
    uVar50 = uVar60 + uVar40;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = uVar47;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = uVar79;
    uVar64 = SUB168(auVar12 * auVar28,8);
    uVar53 = SUB168(auVar12 * auVar28,0);
    uVar48 = uVar58 + uVar53;
    uVar53 = (ulong)CARRY8(uVar58,uVar53);
    uVar63 = uVar50 + uVar64;
    uVar68 = uVar63 + uVar53;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = pcVar84;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = uVar39;
    uVar52 = SUB168(auVar13 * auVar29,8);
    uVar58 = SUB168(auVar13 * auVar29,0);
    sStack_238.n[4] = uVar48 + uVar58;
    uVar58 = (ulong)CARRY8(uVar48,uVar58);
    uVar48 = uVar68 + uVar52;
    uVar51 = uVar48 + uVar58;
    uVar48 = (ulong)(CARRY8(uVar67,uVar49) || CARRY8(uVar60,uVar40)) +
             (ulong)(CARRY8(uVar50,uVar64) || CARRY8(uVar63,uVar53)) +
             (ulong)(CARRY8(uVar68,uVar52) || CARRY8(uVar48,uVar58));
    auVar14._8_8_ = 0;
    auVar14._0_8_ = uVar47;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = r_01;
    uVar60 = SUB168(auVar14 * auVar30,8);
    uVar40 = SUB168(auVar14 * auVar30,0);
    uVar58 = uVar51 + uVar40;
    uVar40 = (ulong)CARRY8(uVar51,uVar40);
    uVar47 = uVar48 + uVar60;
    uVar49 = uVar47 + uVar40;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = pcVar84;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = uVar79;
    uVar63 = SUB168(auVar15 * auVar31,8);
    uVar53 = SUB168(auVar15 * auVar31,0);
    sStack_238._40_8_ = uVar58 + uVar53;
    uVar53 = (ulong)CARRY8(uVar58,uVar53);
    uVar58 = uVar49 + uVar63;
    auStack_208._8_8_ =
         (ulong)(CARRY8(uVar48,uVar60) || CARRY8(uVar47,uVar40)) +
         (ulong)(CARRY8(uVar49,uVar63) || CARRY8(uVar58,uVar53));
    auStack_208._0_8_ = uVar58 + uVar53;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = pcVar84;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = r_01;
    auStack_208 = auVar16 * auVar32 + auStack_208;
    r_00 = &sStack_1f0;
    pcStack_270 = (code *)0x156dfb;
    r_02 = r_00;
    pcStack_260 = pcVar83;
    secp256k1_scalar_reduce_512((secp256k1_scalar *)r_00,(uint64_t *)(auStack_258 + 0x20));
    if (((sStack_1f0.n[0] != 1 || sStack_1f0.n[1] != 0) || sStack_1f0.n[2] != 0) ||
        sStack_1f0.n[3] != 0) {
      pcStack_270 = (code *)0x156ef2;
      test_inverse_scalar_cold_1();
      goto LAB_00156ef2;
    }
    pcStack_270 = (code *)0x156e2b;
    iVar34 = secp256k1_scalar_add
                       ((secp256k1_scalar *)(auStack_258 + 0x20),(secp256k1_scalar *)a_01,
                        &scalar_minus_one);
    pcVar83 = pcStack_260;
    auVar85._0_4_ = -(uint)((int)sStack_238.n[2] == 0 && (int)sStack_238.n[0] == 0);
    auVar85._4_4_ = -(uint)(sStack_238.n[2]._4_4_ == 0 && sStack_238.n[0]._4_4_ == 0);
    auVar85._8_4_ = -(uint)((int)sStack_238.n[3] == 0 && (int)sStack_238.n[1] == 0);
    auVar85._12_4_ = -(uint)(sStack_238.n[3]._4_4_ == 0 && sStack_238.n[1]._4_4_ == 0);
    iVar34 = movmskps(iVar34,auVar85);
    if (iVar34 == 0xf) {
      return;
    }
    r_00 = (secp256k1_fe *)(auStack_258 + 0x20);
    pcStack_270 = (code *)0x156e5b;
    (*pcStack_260)(r_00,r_00);
    r_01 = (secp256k1_fe *)auStack_258;
    pcStack_270 = (code *)0x156e72;
    secp256k1_scalar_add((secp256k1_scalar *)r_01,&scalar_minus_one,(secp256k1_scalar *)r_01);
    pcStack_270 = (code *)0x156e7b;
    (*pcVar83)(r_01,r_01);
    pcStack_270 = (code *)0x156e8d;
    secp256k1_scalar_add((secp256k1_scalar *)r_01,(secp256k1_scalar *)r_01,&secp256k1_scalar_one);
    pcStack_270 = (code *)0x156e9b;
    r_02 = r_01;
    iVar34 = secp256k1_scalar_add
                       ((secp256k1_scalar *)r_01,(secp256k1_scalar *)r_00,(secp256k1_scalar *)r_01);
    auVar87._0_4_ = -(uint)(auStack_258._16_4_ == 0 && auStack_258._0_4_ == 0);
    auVar87._4_4_ = -(uint)(auStack_258._20_4_ == 0 && auStack_258._4_4_ == 0);
    auVar87._8_4_ = -(uint)(auStack_258._24_4_ == 0 && auStack_258._8_4_ == 0);
    auVar87._12_4_ = -(uint)(auStack_258._28_4_ == 0 && auStack_258._12_4_ == 0);
    iVar34 = movmskps(iVar34,auVar87);
    if (iVar34 == 0xf) {
      return;
    }
    pcStack_270 = (code *)0x156ebf;
    test_inverse_scalar_cold_2();
    uVar56 = extraout_EAX;
    uVar44 = extraout_XMM0_Da;
    uVar57 = extraout_XMM0_Db;
    uVar55 = extraout_XMM0_Dc;
    uVar61 = extraout_XMM0_Dd;
  }
  auVar88._0_4_ = -(uint)((auStack_258._16_4_ | auStack_258._0_4_) == uVar44);
  auVar88._4_4_ = -(uint)((auStack_258._20_4_ | auStack_258._4_4_) == uVar57);
  auVar88._8_4_ = -(uint)((auStack_258._24_4_ | auStack_258._8_4_) == uVar55);
  auVar88._12_4_ = -(uint)((auStack_258._28_4_ | auStack_258._12_4_) == uVar61);
  iVar34 = movmskps(uVar56,auVar88);
  pcVar84 = pcVar83;
  if (iVar34 == 0xf) {
    return;
  }
LAB_00156ef2:
  pcStack_270 = random_fe;
  test_inverse_scalar_cold_3();
  psStack_290 = r_00;
  uStack_288 = uVar39;
  uStack_280 = uVar79;
  psStack_278 = r_01;
  pcStack_270 = pcVar84;
  while( true ) {
    secp256k1_testrand256(auStack_2b0);
    secp256k1_fe_impl_set_b32_mod(r_02,auStack_2b0);
    if (((r_02->n[0] < 0xffffefffffc2f) || (r_02->n[4] != 0xffffffffffff)) ||
       ((r_02->n[2] & r_02->n[3] & r_02->n[1]) != 0xfffffffffffff)) break;
    r_02->magnitude = -1;
  }
  r_02->magnitude = 1;
  r_02->normalized = 1;
  secp256k1_fe_verify(r_02);
  return;
}

Assistant:

static void secp256k1_modinv32_mul_30(secp256k1_modinv32_signed30 *r, const secp256k1_modinv32_signed30 *a, int alen, int32_t factor) {
    const int32_t M30 = (int32_t)(UINT32_MAX >> 2);
    int64_t c = 0;
    int i;
    for (i = 0; i < 8; ++i) {
        if (i < alen) c += (int64_t)a->v[i] * factor;
        r->v[i] = (int32_t)c & M30; c >>= 30;
    }
    if (8 < alen) c += (int64_t)a->v[8] * factor;
    VERIFY_CHECK(c == (int32_t)c);
    r->v[8] = (int32_t)c;
}